

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_add_output_at(wally_psbt *psbt,uint32_t index,uint32_t flags,wally_tx_output *output)

{
  int local_2c;
  int ret;
  wally_tx_output *output_local;
  uint32_t flags_local;
  uint32_t index_local;
  wally_psbt *psbt_local;
  
  if (((((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) ||
       (psbt->tx->num_outputs != psbt->num_outputs)) ||
      ((flags != 0 || (psbt->num_outputs < (ulong)index)))) || (output == (wally_tx_output *)0x0)) {
    psbt_local._4_4_ = -2;
  }
  else {
    local_2c = wally_tx_add_output_at(psbt->tx,index,output);
    if (local_2c == 0) {
      if ((psbt->outputs_allocation_len <= psbt->num_outputs) &&
         (local_2c = array_grow(&psbt->outputs,psbt->num_outputs,&psbt->outputs_allocation_len,0xd0)
         , local_2c != 0)) {
        wally_tx_remove_output(psbt->tx,(ulong)index);
        return local_2c;
      }
      memmove(psbt->outputs + (ulong)index + 1,psbt->outputs + index,
              (psbt->num_outputs - (ulong)index) * 0xd0);
      wally_clear(psbt->outputs + index,0xd0);
      psbt->num_outputs = psbt->num_outputs + 1;
    }
    psbt_local._4_4_ = local_2c;
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_add_output_at(struct wally_psbt *psbt,
                             uint32_t index, uint32_t flags,
                             const struct wally_tx_output *output)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_outputs != psbt->num_outputs ||
        flags || index > psbt->num_outputs || !output)
        return WALLY_EINVAL;

    ret = wally_tx_add_output_at(psbt->tx, index, output);

    if (ret == WALLY_OK) {
        if (psbt->num_outputs >= psbt->outputs_allocation_len) {
            ret = array_grow((void *)&psbt->outputs, psbt->num_outputs,
                             &psbt->outputs_allocation_len,
                             sizeof(struct wally_psbt_output));
            if (ret != WALLY_OK) {
                wally_tx_remove_output(psbt->tx, index);
                return ret;
            }
        }

        memmove(psbt->outputs + index + 1, psbt->outputs + index,
                (psbt->num_outputs - index) * sizeof(struct wally_psbt_output));
        wally_clear(psbt->outputs + index, sizeof(struct wally_psbt_output));
        psbt->num_outputs += 1;
    }
    return ret;
}